

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

void * rw::xbox::destroyNativeData(void *object,int32 param_2,int32 param_3)

{
  long lVar1;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  if ((*(long *)((long)object + 0x98) != 0) && (**(int **)((long)object + 0x98) == 5)) {
    lVar1 = *(long *)((long)object + 0x98);
    *(undefined8 *)((long)object + 0x98) = 0;
    (*DAT_00168638)(*(undefined8 *)(lVar1 + 0x18));
    (*DAT_00168638)(*(undefined8 *)(lVar1 + 0x28));
    (*DAT_00168638)(*(undefined8 *)(lVar1 + 0x38));
    (*DAT_00168638)(lVar1);
  }
  return object;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_XBOX)
		return object;
	InstanceDataHeader *header =
		(InstanceDataHeader*)geometry->instData;
	geometry->instData = nil;
	rwFree(header->vertexBuffer);
	rwFree(header->begin);
	rwFree(header->data);
	rwFree(header);
	return object;
}